

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O3

void out_CreatePatch(uint32_t type,Expression *expr,uint32_t ofs,uint32_t pcShift)

{
  Section *pSVar1;
  Patch *pPVar2;
  
  pPVar2 = allocpatch(type,expr,ofs);
  pPVar2->pcOffset = pPVar2->pcOffset - pcShift;
  pSVar1 = currentSection;
  pPVar2->next = currentSection->patches;
  pSVar1->patches = pPVar2;
  return;
}

Assistant:

void out_CreatePatch(uint32_t type, struct Expression const *expr, uint32_t ofs, uint32_t pcShift)
{
	struct Patch *patch = allocpatch(type, expr, ofs);

	// If the patch had a quantity of bytes output before it,
	// PC is not at the patch's location, but at the location
	// before those bytes.
	patch->pcOffset -= pcShift;

	patch->next = currentSection->patches;
	currentSection->patches = patch;
}